

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

bool int_check_event(Am_Object *inter,Am_Object *event_window,Am_Input_Char input_char,
                    Am_Slot_Key when_slot,Am_Value *slot_value,Am_Input_Char *deferred)

{
  Am_Value_Type AVar1;
  bool bVar2;
  byte bVar3;
  Am_Value_Type AVar4;
  int iVar5;
  long lVar6;
  char *s;
  ostream *poVar7;
  Am_Object local_b0;
  Am_Object local_a8;
  undefined1 local_a0 [8];
  Am_Event_Method method;
  Am_Value local_80;
  Am_Input_Char local_70 [4];
  Am_String local_60;
  Am_String sval;
  long val;
  Am_Input_Char target_char;
  bool result;
  Am_Input_Char *deferred_local;
  Am_Value *slot_value_local;
  Am_Slot_Key when_slot_local;
  Am_Object *event_window_local;
  Am_Object *inter_local;
  Am_Input_Char input_char_local;
  
  val._7_1_ = 0;
  _target_char = deferred;
  Am_Input_Char::Am_Input_Char
            ((Am_Input_Char *)&val,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  bVar2 = Am_Value::Valid(slot_value);
  if (bVar2) {
    if ((slot_value->type == 2) || (slot_value->type == 3)) {
      lVar6 = Am_Value::operator_cast_to_long(slot_value);
      val._7_1_ = lVar6 != 0;
    }
    else {
      AVar1 = slot_value->type;
      AVar4 = Am_Input_Char::Type_ID();
      if (AVar1 == AVar4) {
        Am_Input_Char::operator=((Am_Input_Char *)&val,slot_value);
        val._7_1_ = Am_Input_Char::operator==((Am_Input_Char *)&val,input_char);
        if ((!(bool)val._7_1_) &&
           (sval.data._4_4_ = input_char,
           val._7_1_ = check_deferring_event(inter,val._0_4_,input_char), (bool)val._7_1_)) {
          Am_Input_Char::operator=(_target_char,(Am_Input_Char *)&val);
        }
      }
      else if (slot_value->type == 4) {
        val._7_1_ = Am_Value::operator_cast_to_bool(slot_value);
      }
      else if (slot_value->type == 0x8008) {
        Am_String::Am_String(&local_60);
        Am_String::operator=(&local_60,slot_value);
        s = Am_String::operator_cast_to_char_(&local_60);
        Am_Input_Char::Am_Input_Char(local_70,s,true);
        Am_Input_Char::operator=((Am_Input_Char *)&val,local_70);
        if (when_slot != 0) {
          Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_80);
          Am_Object::Set(inter,when_slot,&local_80,0x10000);
          Am_Value::~Am_Value(&local_80);
        }
        val._7_1_ = Am_Input_Char::operator==((Am_Input_Char *)&val,input_char);
        if ((!(bool)val._7_1_) &&
           (method.Call._4_4_ = input_char,
           val._7_1_ = check_deferring_event(inter,val._0_4_,input_char), (bool)val._7_1_)) {
          Am_Input_Char::operator=(_target_char,(Am_Input_Char *)&val);
        }
        Am_String::~Am_String(&local_60);
      }
      else {
        iVar5 = Am_Event_Method::Test(slot_value);
        if (iVar5 == 0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
          poVar7 = std::operator<<(poVar7,"Type of value in when slot is ");
          poVar7 = operator<<(poVar7,slot_value);
          poVar7 = std::operator<<(poVar7,
                                   " but should be a bool, string, Am_Input_Char or Am_Value_List");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
        Am_Event_Method::Am_Event_Method((Am_Event_Method *)local_a0,slot_value);
        Am_Object::Am_Object(&local_a8,inter);
        Am_Object::Am_Object(&local_b0,event_window);
        bVar3 = (*(code *)method.from_wrapper)(&local_a8,&local_b0,input_char);
        val._7_1_ = bVar3 & 1;
        Am_Object::~Am_Object(&local_b0);
        Am_Object::~Am_Object(&local_a8);
      }
    }
  }
  else {
    val._7_1_ = 0;
  }
  return (bool)(val._7_1_ & 1);
}

Assistant:

static bool
int_check_event(Am_Object &inter, Am_Object &event_window,
                Am_Input_Char input_char, Am_Slot_Key when_slot,
                Am_Value &slot_value, Am_Input_Char &deferred)
{
  bool result = false;
  Am_Input_Char target_char;
  if (!slot_value.Valid()) {
    // luckily 0 and (0L) are illegal Am_Input_Char so can use as false
    result = false;
  } else if ((slot_value.type == Am_INT) || (slot_value.type == Am_LONG)) {
    long val = slot_value;
    // first test if event is true or false (for always or never)
    result = (val != 0);
  } else if (slot_value.type == Am_Input_Char::Type_ID()) {
    target_char = slot_value;
    Am_INTER_TRACE_PRINT_NOENDL(inter, target_char);
    // now do comparison
    result = (target_char == input_char);
    if (!result) {
      result = check_deferring_event(inter, target_char, input_char);
      if (result)
        deferred = target_char;
    }
  } else if (slot_value.type == Am_BOOL)
    result = slot_value;
  else if (slot_value.type == Am_STRING) {
    // convert string into right type
    Am_String sval;
    sval = slot_value;
    target_char = Am_Input_Char((const char *)sval);
    Am_INTER_TRACE_PRINT_NOENDL(inter, (const char *)sval
                                           << " (str--converted to Input_Char)="
                                           << target_char);
    if (when_slot) { //otherwise is part of a list, so leave it alone
      // store it back into the slot so more efficient next time
      // (because no parsing will be needed next time)
      //don't delete the constraint in the slot, if any
      inter.Set(when_slot, target_char, Am_KEEP_FORMULAS);
    }
    // now do comparison
    result = (target_char == input_char);
    if (!result) {
      result = check_deferring_event(inter, target_char, input_char);
      if (result)
        deferred = target_char;
    }
  } else if (Am_Event_Method::Test(slot_value)) {
    Am_Event_Method method(slot_value);
    result = method.Call(inter, event_window, input_char);
  } else {
    Am_ERRORO(
        "Type of value in when slot is "
            << slot_value
            << " but should be a bool, string, Am_Input_Char or Am_Value_List",
        inter, when_slot);
  }

// here have result set
#ifdef DEBUG
  if (Am_Inter_Tracing(inter)) {
    if (result)
      std::cout << " * SUCCESS\n" << std::flush;
    else
      std::cout << " * FAILED\n" << std::flush;
  }
#endif
  return result;
}